

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::NextColumn(void)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float width;
  float offset_1;
  float offset_0;
  float local_2c;
  ImGuiColumnData *pIStack_28;
  float column_padding;
  ImGuiColumnData *column;
  ImGuiColumns *columns;
  ImGuiContext *g;
  ImGuiWindow *window;
  
  g = (ImGuiContext *)GetCurrentWindow();
  if ((((uint)(g->IO).DisplayFramebufferScale.y & 1) == 0) &&
     (*(ImGuiColumns **)((ImVec2 *)(g->IO).KeysDown + 0x15) != (ImGuiColumns *)0x0)) {
    columns = (ImGuiColumns *)GImGui;
    column = *(ImGuiColumnData **)((ImVec2 *)(g->IO).KeysDown + 0x15);
    if (((ImGuiColumns *)column)->Count == 1) {
      (((ImGuiWindowTempData *)&(g->IO).ClipboardUserData)->CursorPos).x =
           (float)(int)(((ImVec2 *)((long)((ImVec2 *)(g->IO).KeyMap + 1) + 4))->x +
                        ((ImVec1 *)((ImVec2 *)(g->IO).KeysDown + 2))->x +
                       ((ImVec1 *)((ImVec2 *)(g->IO).KeysDown + 2))[1].x);
      if (((ImGuiColumns *)column)->Current != 0) {
        __assert_fail("columns->Current == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                      ,0x2062,"void ImGui::NextColumn()");
      }
    }
    else {
      iVar1 = ((ImGuiColumns *)column)->Current + 1;
      ((ImGuiColumns *)column)->Current = iVar1;
      if (iVar1 == ((ImGuiColumns *)column)->Count) {
        ((ImGuiColumns *)column)->Current = 0;
      }
      PopItemWidth();
      pIStack_28 = ImVector<ImGuiColumnData>::operator[]
                             ((ImVector<ImGuiColumnData> *)&column[3].ClipRect,
                              (int)(column->ClipRect).Min.x);
      SetWindowClipRectBeforeSetChannel((ImGuiWindow *)g,&pIStack_28->ClipRect);
      ImDrawListSplitter::SetCurrentChannel
                ((ImDrawListSplitter *)(column + 4),*(ImDrawList **)((g->IO).KeysDown + 0x1d8),
                 (int)(column->ClipRect).Min.x + 1);
      local_2c = columns[0x2a].HostInitialClipRect.Max.y;
      fVar2 = ImMax<float>(column[1].OffsetNormBeforeResize,
                           *(float *)((long)&(g->IO).ClipboardUserData + 4));
      column[1].OffsetNormBeforeResize = fVar2;
      if ((int)(column->ClipRect).Min.x < 1) {
        fVar2 = ImMax<float>(local_2c - (float)(g->IO).KeyMap[0xd],0.0);
        *(float *)((g->IO).KeysDown + 0x14) = fVar2;
        column[1].OffsetNorm = column[1].OffsetNormBeforeResize;
      }
      else {
        fVar2 = GetColumnOffset((int)(column->ClipRect).Min.x);
        *(float *)((g->IO).KeysDown + 0x14) =
             (fVar2 - *(float *)((g->IO).KeysDown + 0x10)) + local_2c;
      }
      *(float *)&(g->IO).ClipboardUserData =
           (float)(int)((float)(g->IO).KeyMap[3] + *(float *)((g->IO).KeysDown + 0x10) +
                       *(float *)((g->IO).KeysDown + 0x14));
      *(float *)((long)&(g->IO).ClipboardUserData + 4) = column[1].OffsetNorm;
      ImVec2::ImVec2((ImVec2 *)&offset_1,0.0,0.0);
      *(ImVec2 *)&(g->IO).MouseHoveredViewport = _offset_1;
      (g->IO).KeysDown[8] = false;
      (g->IO).KeysDown[9] = false;
      (g->IO).KeysDown[10] = false;
      (g->IO).KeysDown[0xb] = false;
      fVar2 = GetColumnOffset((int)(column->ClipRect).Min.x);
      fVar3 = GetColumnOffset((int)(column->ClipRect).Min.x + 1);
      PushItemWidth((fVar3 - fVar2) * 0.65);
      *(float *)((g->IO).KeysDown + 0x158) = ((float)(g->IO).KeyMap[3] + fVar3) - local_2c;
    }
  }
  return;
}

Assistant:

void ImGui::NextColumn()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems || window->DC.CurrentColumns == NULL)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiColumns* columns = window->DC.CurrentColumns;

    if (columns->Count == 1)
    {
        window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
        IM_ASSERT(columns->Current == 0);
        return;
    }

    // Next column
    if (++columns->Current == columns->Count)
        columns->Current = 0;

    PopItemWidth();

    // Optimization: avoid PopClipRect() + SetCurrentChannel() + PushClipRect()
    // (which would needlessly attempt to update commands in the wrong channel, then pop or overwrite them),
    ImGuiColumnData* column = &columns->Columns[columns->Current];
    SetWindowClipRectBeforeSetChannel(window, column->ClipRect);
    columns->Splitter.SetCurrentChannel(window->DrawList, columns->Current + 1);

    const float column_padding = g.Style.ItemSpacing.x;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    if (columns->Current > 0)
    {
        // Columns 1+ ignore IndentX (by canceling it out)
        // FIXME-COLUMNS: Unnecessary, could be locked?
        window->DC.ColumnsOffset.x = GetColumnOffset(columns->Current) - window->DC.Indent.x + column_padding;
    }
    else
    {
        // New row/line: column 0 honor IndentX.
        window->DC.ColumnsOffset.x = ImMax(column_padding - window->WindowPadding.x, 0.0f);
        columns->LineMinY = columns->LineMaxY;
    }
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
    window->DC.CursorPos.y = columns->LineMinY;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    window->DC.CurrLineTextBaseOffset = 0.0f;

    // FIXME-COLUMNS: Share code with BeginColumns() - move code on columns setup.
    float offset_0 = GetColumnOffset(columns->Current);
    float offset_1 = GetColumnOffset(columns->Current + 1);
    float width = offset_1 - offset_0;
    PushItemWidth(width * 0.65f);
    window->WorkRect.Max.x = window->Pos.x + offset_1 - column_padding;
}